

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
libcellml::Analyser::AnalyserImpl::updateUnitsMap
          (AnalyserImpl *this,ModelPtr *model,string *unitsName,UnitsMap *unitsMap,bool userUnitsMap
          ,double unitsExponent,double unitsMultiplier)

{
  byte bVar1;
  map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
  *pmVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  element_type *peVar6;
  pointer __k;
  mapped_type *pmVar7;
  size_t sVar8;
  double dVar9;
  double dVar10;
  size_t local_108;
  size_t i;
  string id;
  double multiplier;
  double exponent;
  string prefix;
  string reference;
  _Self local_80;
  _Self local_78;
  iterator iter;
  UnitsPtr units;
  double unitsMultiplier_local;
  double unitsExponent_local;
  map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
  *pmStack_28;
  bool userUnitsMap_local;
  UnitsMap *unitsMap_local;
  string *unitsName_local;
  ModelPtr *model_local;
  AnalyserImpl *this_local;
  
  unitsMultiplier_local = unitsExponent;
  unitsExponent_local._7_1_ = userUnitsMap;
  pmStack_28 = (map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                *)unitsMap;
  unitsMap_local = (UnitsMap *)unitsName;
  unitsName_local = (string *)model;
  model_local = (ModelPtr *)this;
  if (userUnitsMap) {
    bVar3 = std::operator!=(unitsName,"dimensionless");
    if (bVar3) {
      std::
      map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
      ::emplace<std::__cxx11::string_const&,double&>
                (pmStack_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unitsMap_local
                 ,&unitsMultiplier_local);
    }
  }
  else {
    bVar3 = isStandardUnitName(unitsName);
    if (bVar3) {
      updateUnitsMapWithStandardUnit
                (this,(string *)unitsMap_local,(UnitsMap *)pmStack_28,unitsMultiplier_local);
    }
    else {
      psVar5 = (string *)
               std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)unitsName_local);
      Model::units((Model *)&stack0xffffffffffffffa0,psVar5);
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xffffffffffffffa0);
      bVar3 = Units::isBaseUnit(peVar6);
      if (bVar3) {
        local_78._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *)pmStack_28,(key_type *)unitsMap_local);
        local_80._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)pmStack_28);
        bVar3 = std::operator==(&local_78,&local_80);
        pmVar2 = pmStack_28;
        dVar9 = unitsMultiplier_local;
        if (bVar3) {
          std::
          map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
          ::emplace<std::__cxx11::string_const&,double&>
                    (pmStack_28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unitsMap_local,&unitsMultiplier_local);
        }
        else {
          __k = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                ::operator->(&local_78);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)pmVar2,&__k->first);
          *pmVar7 = dVar9 + *pmVar7;
        }
      }
      else {
        std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&exponent);
        std::__cxx11::string::string((string *)&i);
        local_108 = 0;
        while( true ) {
          peVar6 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&stack0xffffffffffffffa0);
          sVar8 = Units::unitCount(peVar6);
          if (sVar8 <= local_108) break;
          peVar6 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&stack0xffffffffffffffa0);
          Units::unitAttributes
                    (peVar6,local_108,(string *)((long)&prefix.field_2 + 8),(string *)&exponent,
                     &multiplier,(double *)((long)&id.field_2 + 8),(string *)&i);
          bVar3 = isStandardUnitName((string *)((long)&prefix.field_2 + 8));
          psVar5 = unitsName_local;
          pmVar2 = pmStack_28;
          bVar1 = unitsExponent_local._7_1_;
          if (bVar3) {
            updateUnitsMapWithStandardUnit
                      (this,(string *)((long)&prefix.field_2 + 8),(UnitsMap *)pmStack_28,
                       multiplier * unitsMultiplier_local);
          }
          else {
            dVar9 = multiplier * unitsMultiplier_local;
            dVar10 = log10((double)id.field_2._8_8_);
            iVar4 = convertPrefixToInt((string *)&exponent,(bool *)0x0);
            updateUnitsMap(this,(ModelPtr *)psVar5,(string *)((long)&prefix.field_2 + 8),
                           (UnitsMap *)pmVar2,(bool)(bVar1 & 1),dVar9,
                           (dVar10 + (double)iVar4) * unitsMultiplier_local + unitsMultiplier);
          }
          local_108 = local_108 + 1;
        }
        std::__cxx11::string::~string((string *)&i);
        std::__cxx11::string::~string((string *)&exponent);
        std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
      }
      std::shared_ptr<libcellml::Units>::~shared_ptr
                ((shared_ptr<libcellml::Units> *)&stack0xffffffffffffffa0);
    }
  }
  return;
}

Assistant:

void Analyser::AnalyserImpl::updateUnitsMap(const ModelPtr &model,
                                            const std::string &unitsName,
                                            UnitsMap &unitsMap,
                                            bool userUnitsMap,
                                            double unitsExponent,
                                            double unitsMultiplier)
{
    // Update the given units map using the given information.

    if (userUnitsMap) {
        if (unitsName != "dimensionless") {
            unitsMap.emplace(unitsName, unitsExponent);
        }
    } else {
        if (isStandardUnitName(unitsName)) {
            updateUnitsMapWithStandardUnit(unitsName, unitsMap, unitsExponent);
        } else {
            UnitsPtr units = model->units(unitsName);

            if (units->isBaseUnit()) {
                auto iter = unitsMap.find(unitsName);

                if (iter == unitsMap.end()) {
                    unitsMap.emplace(unitsName, unitsExponent);
                } else {
                    unitsMap[iter->first] += unitsExponent;
                }
            } else {
                std::string reference;
                std::string prefix;
                double exponent;
                double multiplier;
                std::string id;

                for (size_t i = 0; i < units->unitCount(); ++i) {
                    units->unitAttributes(i, reference, prefix, exponent, multiplier, id);

                    if (isStandardUnitName(reference)) {
                        updateUnitsMapWithStandardUnit(reference, unitsMap, exponent * unitsExponent);
                    } else {
                        updateUnitsMap(model, reference, unitsMap, userUnitsMap,
                                       exponent * unitsExponent,
                                       unitsMultiplier + (std::log10(multiplier) + convertPrefixToInt(prefix)) * unitsExponent);
                    }
                }
            }
        }
    }
}